

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O0

void scheduler_tests::manythreads_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  manythreads t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff608;
  std_string *in_stack_fffffffffffff610;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff618;
  const_string *in_stack_fffffffffffff630;
  const_string *msg;
  size_t in_stack_fffffffffffff638;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff640;
  unit_test_log_t *in_stack_fffffffffffff648;
  manythreads *in_stack_fffffffffffff790;
  undefined1 local_800 [408];
  undefined1 local_668 [408];
  undefined1 local_4d0 [408];
  undefined1 local_338 [408];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [12])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [12])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [16])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::setup_conditional<scheduler_tests::manythreads>((manythreads *)0x9dcf7d);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_4d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [12])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [13])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  manythreads::test_method(in_stack_fffffffffffff790);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [12])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [19])in_stack_fffffffffffff610);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::teardown_conditional<scheduler_tests::manythreads>((manythreads *)0x9dd1b8);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  file = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [12])in_stack_fffffffffffff610);
  this_00 = boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(manythreads)
{
    // Stress test: hundreds of microsecond-scheduled tasks,
    // serviced by 10 threads.
    //
    // So... ten shared counters, which if all the tasks execute
    // properly will sum to the number of tasks done.
    // Each task adds or subtracts a random amount from one of the
    // counters, and then schedules another task 0-1000
    // microseconds in the future to subtract or add from
    // the counter -random_amount+1, so in the end the shared
    // counters should sum to the number of initial tasks performed.
    CScheduler microTasks;

    std::mutex counterMutex[10];
    int counter[10] = { 0 };
    FastRandomContext rng{/*fDeterministic=*/true};
    auto zeroToNine = [](FastRandomContext& rc) -> int { return rc.randrange(10); }; // [0, 9]
    auto randomMsec = [](FastRandomContext& rc) -> int { return -11 + (int)rc.randrange(1012); }; // [-11, 1000]
    auto randomDelta = [](FastRandomContext& rc) -> int { return -1000 + (int)rc.randrange(2001); }; // [-1000, 1000]

    auto start = std::chrono::steady_clock::now();
    auto now = start;
    std::chrono::steady_clock::time_point first, last;
    size_t nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 0);

    for (int i = 0; i < 100; ++i) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }
    nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 100);
    BOOST_CHECK(first < last);
    BOOST_CHECK(last > now);

    // As soon as these are created they will start running and servicing the queue
    std::vector<std::thread> microThreads;
    microThreads.reserve(10);
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));

    UninterruptibleSleep(std::chrono::microseconds{600});
    now = std::chrono::steady_clock::now();

    // More threads and more tasks:
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));
    for (int i = 0; i < 100; i++) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }

    // Drain the task queue then exit threads
    microTasks.StopWhenDrained();
    // wait until all the threads are done
    for (auto& thread: microThreads) {
        if (thread.joinable()) thread.join();
    }

    int counterSum = 0;
    for (int i = 0; i < 10; i++) {
        BOOST_CHECK(counter[i] != 0);
        counterSum += counter[i];
    }
    BOOST_CHECK_EQUAL(counterSum, 200);
}